

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_set_null(JSON_Object *object,char *name)

{
  JSON_Status JVar1;
  JSON_Value *value;
  
  value = json_value_init_null();
  JVar1 = json_object_set_value(object,name,value);
  if (JVar1 != 0) {
    json_value_free(value);
  }
  return JVar1;
}

Assistant:

JSON_Status json_object_set_null(JSON_Object *object, const char *name) {
    JSON_Value *value = json_value_init_null();
    JSON_Status status = json_object_set_value(object, name, value);
    if (status != JSONSuccess) {
        json_value_free(value);
    }
    return status;
}